

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcodecompile.cc
# Opt level: O1

void __thiscall PcodeCompile::newLocalDefinition(PcodeCompile *this,string *varname,uint4 size)

{
  pointer pcVar1;
  anon_union_8_2_16792c89_for_value aVar2;
  VarnodeTpl *pVVar3;
  VarnodeSymbol *this_00;
  ConstTpl local_48;
  
  pVVar3 = buildTemporary(this);
  if (size != 0) {
    ConstTpl::ConstTpl(&local_48,real,(ulong)size);
    aVar2._4_4_ = local_48.value._4_4_;
    aVar2.handle_index = local_48.value.handle_index;
    *(ulong *)((long)&(pVVar3->size).value + 4) =
         CONCAT44((undefined4)local_48.value_real,local_48.value._4_4_);
    *(undefined8 *)((long)&(pVVar3->size).value_real + 4) = local_48._20_8_;
    (pVVar3->size).type = local_48.type;
    *(undefined4 *)&(pVVar3->size).field_0x4 = local_48._4_4_;
    (pVVar3->size).value = aVar2;
  }
  this_00 = (VarnodeSymbol *)operator_new(0x58);
  VarnodeSymbol::VarnodeSymbol
            (this_00,varname,(pVVar3->space).value.spaceid,(pVVar3->offset).value_real,
             (int4)(pVVar3->size).value_real);
  (*this->_vptr_PcodeCompile[1])(this,this_00);
  pcVar1 = (varname->_M_dataplus)._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &varname->field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(varname);
  return;
}

Assistant:

void PcodeCompile::newLocalDefinition(string *varname,uint4 size)

{ // Create a new temporary symbol (without generating any pcode)
  VarnodeSymbol *sym;
  VarnodeTpl *tmpvn = buildTemporary();
  if (size != 0)
    tmpvn->setSize(ConstTpl(ConstTpl::real,size)); // Size was explicitly specified
  sym = new VarnodeSymbol(*varname,tmpvn->getSpace().getSpace(),tmpvn->getOffset().getReal(),tmpvn->getSize().getReal());
  addSymbol(sym);
  delete varname;
}